

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O2

void __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
AMHAStar(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
        EnvironmentPtr *env_ptr,double time_limit,double epsilon,double mha_epsilon,
        double del_epsilon,double del_mha_epsilon,int num_inad)

{
  Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::Dijkstra
            (&this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
             ,env_ptr,time_limit);
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  _vptr_Dijkstra = (_func_int **)&PTR_run_0010ec90;
  (this->open_inad_).
  super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->open_inad_).
  super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->open_inad_).
  super__Vector_base<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->closed_inad_)._M_h._M_buckets = &(this->closed_inad_)._M_h._M_single_bucket;
  (this->closed_inad_)._M_h._M_bucket_count = 1;
  (this->closed_inad_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->closed_inad_)._M_h._M_element_count = 0;
  (this->closed_inad_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->closed_inad_)._M_h._M_rehash_policy._M_next_resize,0,0xb8);
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.eps_ = epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.mha_eps_ = mha_epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.delta_eps_ = del_epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.delta_mha_eps_ = del_mha_epsilon;
  (this->super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
  params_.num_inad_ = num_inad;
  std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>::reserve
            (&this->open_inad_,(long)num_inad);
  return;
}

Assistant:

AMHAStar(EnvironmentPtr& env_ptr,
             double time_limit,
             double epsilon,
             double mha_epsilon,
             double del_epsilon,
             double del_mha_epsilon,
             int num_inad) : Dijkstra<Environment,
      State,
      HeapValueType>(env_ptr,
                     time_limit)
    {
      this->params_.eps_ = epsilon;
      this->params_.mha_eps_ = mha_epsilon;
      
      this->params_.delta_eps_ = del_epsilon;
      this->params_.delta_mha_eps_ = del_mha_epsilon;
      
      this->params_.num_inad_ = num_inad;
      
      open_inad_.reserve(num_inad);
    }